

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpresponseparser.h
# Opt level: O1

ParseResult __thiscall
httpparser::HttpResponseParser::consume
          (HttpResponseParser *this,Response *resp,char *begin,char *end)

{
  pointer *ppcVar1;
  size_t *psVar2;
  byte bVar3;
  iterator iVar4;
  char *__s1;
  bool bVar5;
  State SVar6;
  size_t sVar7;
  pointer pHVar8;
  uint uVar9;
  pointer pHVar10;
  pointer pHVar11;
  char cVar12;
  ParseResult in_R10D;
  ParseResult PVar13;
  int iVar14;
  long lVar15;
  HeaderItem local_c8;
  string *local_80;
  vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
  *local_78;
  string *local_70;
  vector<char,std::allocator<char>> *local_68;
  pointer local_60;
  ParseResult local_54;
  byte *local_50;
  byte local_41;
  HttpResponseParser *pHStack_40;
  char input;
  Response *local_38;
  
  local_68 = (vector<char,std::allocator<char>> *)&resp->content;
  local_80 = &this->chunkSizeStr;
  local_78 = &resp->headers;
  local_70 = &resp->status;
  local_50 = (byte *)end;
  pHStack_40 = this;
  local_38 = resp;
  do {
    if (begin == end) {
      return ParsingIncompleted;
    }
    bVar3 = *begin;
    PVar13 = ParsingError;
    if (this->state < (ChunkData|ResponseHttpVersion_ht)) {
      iVar14 = (int)(char)bVar3;
      uVar9 = (uint)bVar3;
      cVar12 = (char)local_70;
      local_41 = bVar3;
      switch(this->state) {
      case ResponseStatusStart:
        if (bVar3 != 0x48) goto LAB_00108618;
        this->state = ResponseHttpVersion_ht;
        break;
      case ResponseHttpVersion_ht:
        if (bVar3 != 0x54) goto LAB_00108618;
        this->state = ResponseHttpVersion_htt;
        break;
      case ResponseHttpVersion_htt:
        if (bVar3 != 0x54) goto LAB_00108618;
        this->state = ResponseHttpVersion_http;
        break;
      case ResponseHttpVersion_http:
        if (bVar3 != 0x50) goto LAB_00108618;
        this->state = ResponseHttpVersion_slash;
        break;
      case ResponseHttpVersion_slash:
        if (bVar3 != 0x2f) goto LAB_00108618;
        resp->versionMajor = 0;
        resp->versionMinor = 0;
        this->state = ResponseHttpVersion_majorStart;
        break;
      case ResponseHttpVersion_majorStart:
        if (9 < iVar14 - 0x30U) goto LAB_00108618;
        resp->versionMajor = iVar14 - 0x30U;
        this->state = ResponseHttpVersion_major;
        break;
      case ResponseHttpVersion_major:
        if (bVar3 == 0x2e) {
          this->state = ResponseHttpVersion_minorStart;
        }
        else {
          if (9 < iVar14 - 0x30U) goto LAB_00108618;
          resp->versionMajor = iVar14 + resp->versionMajor * 10 + -0x30;
        }
        break;
      case ResponseHttpVersion_minorStart:
        if (9 < iVar14 - 0x30U) goto LAB_00108618;
        resp->versionMinor = iVar14 - 0x30U;
        this->state = ResponseHttpVersion_minor;
        break;
      case ResponseHttpVersion_minor:
        if (bVar3 == 0x20) {
          this->state = ResponseHttpVersion_statusCodeStart;
          resp->statusCode = 0;
        }
        else {
          if (9 < iVar14 - 0x30U) goto LAB_00108618;
          resp->versionMinor = iVar14 + resp->versionMinor * 10 + -0x30;
        }
        break;
      case ResponseHttpVersion_statusCodeStart:
        if (9 < iVar14 - 0x30U) goto LAB_00108618;
        resp->statusCode = iVar14 - 0x30U;
        this->state = ResponseHttpVersion_statusCode;
        break;
      case ResponseHttpVersion_statusCode:
        if (iVar14 - 0x30U < 10) {
          resp->statusCode = (iVar14 + resp->statusCode * 10) - 0x30;
        }
        else {
          if (bVar3 != 0x20 || 899 < resp->statusCode - 100) goto LAB_00108618;
          this->state = ResponseHttpVersion_statusTextStart;
        }
        break;
      case ResponseHttpVersion_statusTextStart:
        if ((char)bVar3 < '\0') goto LAB_00108618;
        std::__cxx11::string::push_back(cVar12);
        pHStack_40->state = ResponseHttpVersion_statusText;
        end = (char *)local_50;
        this = pHStack_40;
        resp = local_38;
        break;
      case ResponseHttpVersion_statusText:
        if (bVar3 == 0xd) {
          this->state = ResponseHttpVersion_newLine;
        }
        else {
          if ((char)bVar3 < '\0') goto LAB_00108618;
LAB_001086bc:
          std::__cxx11::string::push_back(cVar12);
          end = (char *)local_50;
          this = pHStack_40;
          resp = local_38;
        }
        break;
      default:
        if (bVar3 != 10) goto LAB_00108618;
        this->state = HeaderLineStart;
        break;
      case HeaderLineStart:
        if (bVar3 == 0xd) {
          this->state = ExpectingNewline_3;
        }
        else if (((resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish) || ((bVar3 != 0x20 && (bVar3 != 9))))
        {
          if (((char)bVar3 < '\0') || (bVar3 == 0x7f || bVar3 < 0x20)) goto LAB_00108618;
          bVar5 = false;
          if (((bVar3 - 9 < 0x38) && ((0xfe004982800001U >> ((ulong)(bVar3 - 9) & 0x3f) & 1) != 0))
             || ((uVar9 - 0x5b < 0x23 && ((0x500000007U >> ((ulong)(uVar9 - 0x5b) & 0x3f) & 1) != 0)
                 ))) goto LAB_001087f0;
          local_c8.name.field_2._8_8_ = 0;
          local_c8.value.field_2._8_8_ = 0;
          local_c8.name._M_dataplus._M_p = (pointer)&local_c8.name.field_2;
          local_c8.name._M_string_length = 0;
          local_c8.name.field_2._M_allocated_capacity = 0;
          local_c8.value._M_dataplus._M_p = (pointer)&local_c8.value.field_2;
          local_c8.value._M_string_length = 0;
          local_c8.value.field_2._M_allocated_capacity = 0;
          std::
          vector<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
          ::emplace_back<httpparser::Response::HeaderItem>(local_78,&local_c8);
          Response::HeaderItem::~HeaderItem(&local_c8);
          resp = local_38;
          std::__cxx11::string::reserve
                    ((ulong)((local_38->headers).
                             super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1));
          std::__cxx11::string::reserve
                    ((ulong)&(resp->headers).
                             super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1].value);
          std::__cxx11::string::push_back
                    ((char)(resp->headers).
                           super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x40);
          pHStack_40->state = HeaderName;
          end = (char *)local_50;
          this = pHStack_40;
        }
        else {
          this->state = HeaderLws;
        }
        break;
      case HeaderLws:
        if ((uVar9 != 9) && (bVar3 != 0x20)) {
          if (bVar3 != 0xd) {
            if (bVar3 != 0x7f && 0x1f < bVar3) {
              this->state = HeaderValue;
              goto LAB_001086b4;
            }
            goto LAB_00108618;
          }
          this->state = ExpectingNewline_2;
        }
        break;
      case HeaderName:
        if (bVar3 != 0x3a) {
          if ((-1 < (char)bVar3) && (bVar3 != 0x7f && 0x1f < bVar3)) {
            bVar5 = false;
            if (((0x37 < bVar3 - 9) || ((0xfe004982800001U >> ((ulong)(bVar3 - 9) & 0x3f) & 1) == 0)
                ) && ((0x22 < uVar9 - 0x5b ||
                      ((0x500000007U >> ((ulong)(uVar9 - 0x5b) & 0x3f) & 1) == 0)))) {
              cVar12 = (char)(resp->headers).
                             super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -0x40;
              goto LAB_001086bc;
            }
            goto LAB_001087f0;
          }
          goto LAB_00108618;
        }
        this->state = SpaceBeforeHeaderValue;
        break;
      case SpaceBeforeHeaderValue:
        if (bVar3 != 0x20) goto LAB_00108618;
        this->state = HeaderValue;
        break;
      case HeaderValue:
        if (bVar3 != 0xd) {
          if (bVar3 != 0x7f && 0x1f < bVar3) {
LAB_001086b4:
            cVar12 = (char)(resp->headers).
                           super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -0x20;
            goto LAB_001086bc;
          }
          goto LAB_00108618;
        }
        pHVar10 = (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __s1 = pHVar10[-1].name._M_dataplus._M_p;
        iVar14 = strcasecmp(__s1,"Content-Length");
        if (iVar14 == 0) {
          iVar14 = atoi(pHVar10[-1].value._M_dataplus._M_p);
          pHStack_40->contentSize = (long)iVar14;
          std::vector<char,_std::allocator<char>_>::reserve
                    ((vector<char,_std::allocator<char>_> *)local_68,(long)iVar14);
        }
        else {
          iVar14 = strcasecmp(__s1,"Transfer-Encoding");
          if ((iVar14 == 0) &&
             (iVar14 = strcasecmp(pHVar10[-1].value._M_dataplus._M_p,"chunked"), iVar14 == 0)) {
            pHStack_40->chunked = true;
          }
        }
        pHStack_40->state = ExpectingNewline_2;
        end = (char *)local_50;
        this = pHStack_40;
        resp = local_38;
        break;
      case ExpectingNewline_3:
        pHVar10 = (resp->headers).
                  super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pHVar8 = (resp->headers).
                 super__Vector_base<httpparser::Response::HeaderItem,_std::allocator<httpparser::Response::HeaderItem>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        lVar15 = (long)pHVar8 - (long)pHVar10 >> 8;
        pHVar11 = pHVar10;
        if (0 < lVar15) {
          pHVar11 = (pointer)((long)&(pHVar10->name)._M_dataplus._M_p +
                             ((long)pHVar8 - (long)pHVar10 & 0xffffffffffffff00U));
          lVar15 = lVar15 + 1;
          pHVar10 = pHVar10 + 2;
          local_60 = pHVar8;
          local_54 = in_R10D;
          do {
            iVar14 = strcasecmp(pHVar10[-2].name._M_dataplus._M_p,"Connection");
            if (iVar14 == 0) {
              pHVar8 = local_60;
              pHVar10 = pHVar10 + -2;
              resp = local_38;
              in_R10D = local_54;
              goto LAB_00108765;
            }
            iVar14 = strcasecmp(pHVar10[-1].name._M_dataplus._M_p,"Connection");
            if (iVar14 == 0) {
              pHVar8 = local_60;
              pHVar10 = pHVar10 + -1;
              resp = local_38;
              in_R10D = local_54;
              goto LAB_00108765;
            }
            iVar14 = strcasecmp((pHVar10->name)._M_dataplus._M_p,"Connection");
            pHVar8 = local_60;
            resp = local_38;
            in_R10D = local_54;
            if (iVar14 == 0) goto LAB_00108765;
            iVar14 = strcasecmp(pHVar10[1].name._M_dataplus._M_p,"Connection");
            resp = local_38;
            pHVar8 = local_60;
            in_R10D = local_54;
            if (iVar14 == 0) {
              pHVar10 = pHVar10 + 1;
              goto LAB_00108765;
            }
            lVar15 = lVar15 + -1;
            pHVar10 = pHVar10 + 4;
          } while (1 < lVar15);
        }
        lVar15 = (long)pHVar8 - (long)pHVar11 >> 6;
        if (lVar15 == 1) {
LAB_00108728:
          iVar14 = strcasecmp((pHVar11->name)._M_dataplus._M_p,"Connection");
          pHVar10 = pHVar11;
          resp = local_38;
          if (iVar14 != 0) {
            pHVar10 = pHVar8;
          }
        }
        else if (lVar15 == 2) {
LAB_00108709:
          iVar14 = strcasecmp((pHVar11->name)._M_dataplus._M_p,"Connection");
          pHVar10 = pHVar11;
          resp = local_38;
          if (iVar14 != 0) {
            pHVar11 = pHVar11 + 1;
            goto LAB_00108728;
          }
        }
        else {
          pHVar10 = pHVar8;
          if ((lVar15 == 3) &&
             (iVar14 = strcasecmp((pHVar11->name)._M_dataplus._M_p,"Connection"), pHVar10 = pHVar11,
             resp = local_38, iVar14 != 0)) {
            pHVar11 = pHVar11 + 1;
            goto LAB_00108709;
          }
        }
LAB_00108765:
        if (pHVar10 == pHVar8) {
          if ((1 < resp->versionMajor) || ((resp->versionMajor == 1 && (resp->versionMinor == 1))))
          {
            resp->keepAlive = true;
          }
        }
        else {
          iVar14 = strcasecmp((pHVar10->value)._M_dataplus._M_p,"Keep-Alive");
          resp = local_38;
          if (iVar14 == 0) {
            local_38->keepAlive = true;
          }
          else {
            local_38->keepAlive = false;
          }
        }
        SVar6 = ChunkSize;
        if ((pHStack_40->chunked == false) && (SVar6 = Post, pHStack_40->contentSize == 0)) {
          in_R10D = (uint)(bVar3 != 10) * 2;
          bVar5 = false;
        }
        else {
          pHStack_40->state = SVar6;
          bVar5 = true;
        }
        end = (char *)local_50;
        this = pHStack_40;
        if (bVar5) break;
        bVar5 = false;
        PVar13 = in_R10D;
        goto LAB_001087f0;
      case Post:
        this->contentSize = this->contentSize - 1;
        iVar4._M_current =
             (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_68,iVar4,(char *)&local_41);
          end = (char *)local_50;
          this = pHStack_40;
          resp = local_38;
        }
        else {
          *iVar4._M_current = bVar3;
          ppcVar1 = &(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        if (this->contentSize == 0) {
          bVar5 = false;
          PVar13 = ParsingCompleted;
          goto LAB_001087f0;
        }
        break;
      case ChunkSize:
        iVar14 = isalnum(iVar14);
        if (iVar14 == 0) {
          resp = local_38;
          end = (char *)local_50;
          this = pHStack_40;
          if (bVar3 == 0xd) {
            pHStack_40->state = ChunkSizeNewLine;
          }
          else {
            if (bVar3 != 0x3b) goto LAB_00108618;
            pHStack_40->state = ChunkExtensionName;
          }
        }
        else {
          std::__cxx11::string::push_back((char)local_80);
          end = (char *)local_50;
          this = pHStack_40;
          resp = local_38;
        }
        break;
      case ChunkExtensionName:
        local_54 = in_R10D;
        iVar14 = isalnum(iVar14);
        end = (char *)local_50;
        this = pHStack_40;
        resp = local_38;
        in_R10D = local_54;
        if (bVar3 != 0x20 && iVar14 == 0) {
          if (bVar3 == 0xd) {
            pHStack_40->state = ChunkSizeNewLine;
          }
          else {
            if (bVar3 != 0x3d) goto LAB_00108618;
            pHStack_40->state = ChunkExtensionValue;
          }
        }
        break;
      case ChunkExtensionValue:
      case ChunkTrailerValue:
        iVar14 = isalnum(iVar14);
        end = (char *)local_50;
        this = pHStack_40;
        resp = local_38;
        if (bVar3 != 0x20 && iVar14 == 0) {
          if (bVar3 != 0xd) {
LAB_0010862d:
            bVar5 = false;
            end = (char *)local_50;
            this = pHStack_40;
            resp = local_38;
            goto LAB_001087f0;
          }
          pHStack_40->state = ChunkSizeNewLine;
        }
        break;
      case ChunkSizeNewLine:
        if (bVar3 != 10) goto LAB_00108618;
        sVar7 = strtol((pHStack_40->chunkSizeStr)._M_dataplus._M_p,(char **)0x0,0x10);
        pHStack_40->chunkSize = sVar7;
        (pHStack_40->chunkSizeStr)._M_string_length = 0;
        *(pHStack_40->chunkSizeStr)._M_dataplus._M_p = '\0';
        std::vector<char,_std::allocator<char>_>::reserve
                  ((vector<char,_std::allocator<char>_> *)local_68,
                   (size_type)
                   ((resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish +
                   (pHStack_40->chunkSize -
                   (long)(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start)));
        resp = local_38;
        end = (char *)local_50;
        this = pHStack_40;
        if (pHStack_40->chunkSize == 0) {
          pHStack_40->state = ChunkSizeNewLine_2;
        }
        else {
          pHStack_40->state = ChunkData;
        }
        break;
      case ChunkSizeNewLine_2:
        if (bVar3 == 0xd) {
          this->state = ChunkSizeNewLine_3;
        }
        else {
          iVar14 = isalpha(iVar14);
          if (iVar14 == 0) goto LAB_0010862d;
          pHStack_40->state = ChunkTrailerName;
          end = (char *)local_50;
          this = pHStack_40;
          resp = local_38;
        }
        break;
      case ChunkSizeNewLine_3:
        PVar13 = (uint)(bVar3 != 10) * 2;
        goto LAB_00108618;
      case ChunkTrailerName:
        iVar14 = isalnum(iVar14);
        end = (char *)local_50;
        this = pHStack_40;
        resp = local_38;
        if (iVar14 == 0) {
          if (bVar3 != 0x3a) goto LAB_0010862d;
          pHStack_40->state = ChunkTrailerValue;
        }
        break;
      case ChunkDataNewLine_1:
        if (bVar3 != 0xd) goto LAB_00108618;
        this->state = ChunkDataNewLine_2;
        break;
      case ChunkDataNewLine_2:
        if (bVar3 != 10) goto LAB_00108618;
        this->state = ChunkSize;
        break;
      case ChunkData:
        iVar4._M_current =
             (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    (local_68,iVar4,(char *)&local_41);
          end = (char *)local_50;
          this = pHStack_40;
          resp = local_38;
        }
        else {
          *iVar4._M_current = bVar3;
          ppcVar1 = &(resp->content).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        psVar2 = &this->chunkSize;
        *psVar2 = *psVar2 - 1;
        if (*psVar2 == 0) {
          this->state = ChunkDataNewLine_1;
        }
      }
      bVar5 = true;
      PVar13 = in_R10D;
    }
    else {
LAB_00108618:
      bVar5 = false;
    }
LAB_001087f0:
    in_R10D = PVar13;
    begin = (char *)((byte *)begin + 1);
    if (!bVar5) {
      return in_R10D;
    }
  } while( true );
}

Assistant:

ParseResult consume(Response &resp, const char *begin, const char *end)
    {
        while( begin != end )
        {
            char input = *begin++;

            switch (state)
            {
            case ResponseStatusStart:
                if( input != 'H' )
                {
                    return ParsingError;
                }
                else
                {
                    state = ResponseHttpVersion_ht;
                }
                break;
            case ResponseHttpVersion_ht:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_htt;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_htt:
                if( input == 'T' )
                {
                    state = ResponseHttpVersion_http;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_http:
                if( input == 'P' )
                {
                    state = ResponseHttpVersion_slash;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_slash:
                if( input == '/' )
                {
                    resp.versionMajor = 0;
                    resp.versionMinor = 0;
                    state = ResponseHttpVersion_majorStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_majorStart:
                if( isDigit(input) )
                {
                    resp.versionMajor = input - '0';
                    state = ResponseHttpVersion_major;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_major:
                if( input == '.' )
                {
                    state = ResponseHttpVersion_minorStart;
                }
                else if( isDigit(input) )
                {
                    resp.versionMajor = resp.versionMajor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minorStart:
                if( isDigit(input) )
                {
                    resp.versionMinor = input - '0';
                    state = ResponseHttpVersion_minor;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_minor:
                if( input == ' ')
                {
                    state = ResponseHttpVersion_statusCodeStart;
                    resp.statusCode = 0;
                }
                else if( isDigit(input) )
                {
                    resp.versionMinor = resp.versionMinor * 10 + input - '0';
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCodeStart:
                if( isDigit(input) )
                {
                    resp.statusCode = input - '0';
                    state = ResponseHttpVersion_statusCode;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusCode:
                if( isDigit(input) )
                {
                    resp.statusCode = resp.statusCode * 10 + input - '0';
                }
                else
                {
                    if( resp.statusCode < 100 || resp.statusCode > 999 )
                    {
                        return ParsingError;
                    }
                    else if( input == ' ' )
                    {
                        state = ResponseHttpVersion_statusTextStart;
                    }
                    else
                    {
                        return ParsingError;
                    }
                }
                break;
            case ResponseHttpVersion_statusTextStart:
                if( isChar(input) )
                {
                    resp.status += input;
                    state = ResponseHttpVersion_statusText;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_statusText:
                if( input == '\r' )
                {
                    state = ResponseHttpVersion_newLine;
                }
                else if( isChar(input) )
                {
                    resp.status += input;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ResponseHttpVersion_newLine:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderLineStart:
                if( input == '\r' )
                {
                    state = ExpectingNewline_3;
                }
                else if( !resp.headers.empty() && (input == ' ' || input == '\t') )
                {
                    state = HeaderLws;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.push_back(Response::HeaderItem());
                    resp.headers.back().name.reserve(16);
                    resp.headers.back().value.reserve(16);
                    resp.headers.back().name.push_back(input);
                    state = HeaderName;
                }
                break;
            case HeaderLws:
                if( input == '\r' )
                {
                    state = ExpectingNewline_2;
                }
                else if( input == ' ' || input == '\t' )
                {
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    state = HeaderValue;
                    resp.headers.back().value.push_back(input);
                }
                break;
            case HeaderName:
                if( input == ':' )
                {
                    state = SpaceBeforeHeaderValue;
                }
                else if( !isChar(input) || isControl(input) || isSpecial(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().name.push_back(input);
                }
                break;
            case SpaceBeforeHeaderValue:
                if( input == ' ' )
                {
                    state = HeaderValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case HeaderValue:
                if( input == '\r' )
                {
                    Response::HeaderItem &h = resp.headers.back();

                    if( strcasecmp(h.name.c_str(), "Content-Length") == 0 )
                    {
                        contentSize = atoi(h.value.c_str());
                        resp.content.reserve( contentSize );
                    }
                    else if( strcasecmp(h.name.c_str(), "Transfer-Encoding") == 0 )
                    {
                        if(strcasecmp(h.value.c_str(), "chunked") == 0)
                            chunked = true;
                    }
                    state = ExpectingNewline_2;
                }
                else if( isControl(input) )
                {
                    return ParsingError;
                }
                else
                {
                    resp.headers.back().value.push_back(input);
                }
                break;
            case ExpectingNewline_2:
                if( input == '\n' )
                {
                    state = HeaderLineStart;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ExpectingNewline_3: {
                std::vector<Response::HeaderItem>::iterator it = std::find_if(resp.headers.begin(),
                                                                    resp.headers.end(),
                                                                    checkIfConnection);

                if( it != resp.headers.end() )
                {
                    if( strcasecmp(it->value.c_str(), "Keep-Alive") == 0 )
                    {
                        resp.keepAlive = true;
                    }
                    else  // == Close
                    {
                        resp.keepAlive = false;
                    }
                }
                else
                {
                    if( resp.versionMajor > 1 || (resp.versionMajor == 1 && resp.versionMinor == 1) )
                        resp.keepAlive = true;
                }

                if( chunked )
                {
                    state = ChunkSize;
                }
                else if( contentSize == 0 )
                {
                    if( input == '\n')
                        return ParsingCompleted;
                    else
                        return ParsingError;
                }

                else
                {
                    state = Post;
                }
                break;
            }
            case Post:
                --contentSize;
                resp.content.push_back(input);

                if( contentSize == 0 )
                {
                    return ParsingCompleted;
                }
                break;
            case ChunkSize:
                if( isalnum(input) )
                {
                    chunkSizeStr.push_back(input);
                }
                else if( input == ';' )
                {
                    state = ChunkExtensionName;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionName:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '=' )
                {
                    state = ChunkExtensionValue;
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkExtensionValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine:
                if( input == '\n' )
                {
                    chunkSize = strtol(chunkSizeStr.c_str(), NULL, 16);
                    chunkSizeStr.clear();
                    resp.content.reserve(resp.content.size() + chunkSize);

                    if( chunkSize == 0 )
                        state = ChunkSizeNewLine_2;
                    else
                        state = ChunkData;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_2:
                if( input == '\r' )
                {
                    state = ChunkSizeNewLine_3;
                }
                else if( isalpha(input) )
                {
                    state = ChunkTrailerName;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkSizeNewLine_3:
                if( input == '\n' )
                {
                    return ParsingCompleted;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerName:
                if( isalnum(input) )
                {
                    // skip
                }
                else if( input == ':' )
                {
                    state = ChunkTrailerValue;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkTrailerValue:
                if( isalnum(input) || input == ' ' )
                {
                    // skip
                }
                else if( input == '\r' )
                {
                    state = ChunkSizeNewLine;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkData:
                resp.content.push_back(input);

                if( --chunkSize == 0 )
                {
                    state = ChunkDataNewLine_1;
                }
                break;
            case ChunkDataNewLine_1:
                if( input == '\r' )
                {
                    state = ChunkDataNewLine_2;
                }
                else
                {
                    return ParsingError;
                }
                break;
            case ChunkDataNewLine_2:
                if( input == '\n' )
                {
                    state = ChunkSize;
                }
                else
                {
                    return ParsingError;
                }
                break;
            default:
                return ParsingError;
            }
        }

        return ParsingIncompleted;
    }